

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Model::MergeFrom(Model *this,Model *from)

{
  uint32 uVar1;
  void *pvVar2;
  LogMessage *other;
  ModelDescription *pMVar3;
  GLMClassifier *pGVar4;
  OneHotEncoder *pOVar5;
  GLMRegressor *pGVar6;
  TextClassifier *pTVar7;
  ItemSimilarityRecommender *pIVar8;
  Pipeline *pPVar9;
  SerializedModel *pSVar10;
  LinkedModel *pLVar11;
  NonMaximumSuppression *pNVar12;
  ArrayFeatureExtractor *pAVar13;
  CategoricalMapping *pCVar14;
  Scaler *pSVar15;
  Imputer *pIVar16;
  FeatureVectorizer *pFVar17;
  DictVectorizer *pDVar18;
  Normalizer *pNVar19;
  BayesianProbitRegressor *pBVar20;
  KNearestNeighborsClassifier *pKVar21;
  NeuralNetwork *pNVar22;
  CustomModel *pCVar23;
  TreeEnsembleRegressor *pTVar24;
  TreeEnsembleClassifier *pTVar25;
  NeuralNetworkRegressor *pNVar26;
  PipelineRegressor *pPVar27;
  NeuralNetworkClassifier *pNVar28;
  SupportVectorRegressor *pSVar29;
  PipelineClassifier *pPVar30;
  SupportVectorClassifier *pSVar31;
  Identity *pIVar32;
  Gazetteer *pGVar33;
  VisionFeaturePrint *pVVar34;
  SoundAnalysisPreprocessing *pSVar35;
  WordTagger *pWVar36;
  WordEmbedding *pWVar37;
  NonMaximumSuppression *from_00;
  ArrayFeatureExtractor *from_01;
  CategoricalMapping *from_02;
  Scaler *from_03;
  Imputer *from_04;
  FeatureVectorizer *from_05;
  OneHotEncoder *from_06;
  DictVectorizer *from_07;
  Normalizer *from_08;
  BayesianProbitRegressor *from_09;
  KNearestNeighborsClassifier *from_10;
  NeuralNetwork *from_11;
  CustomModel *from_12;
  ItemSimilarityRecommender *from_13;
  LinkedModel *from_14;
  TreeEnsembleRegressor *from_15;
  TreeEnsembleClassifier *from_16;
  NeuralNetworkRegressor *from_17;
  NeuralNetworkClassifier *from_18;
  GLMRegressor *from_19;
  SupportVectorRegressor *from_20;
  GLMClassifier *from_21;
  SupportVectorClassifier *from_22;
  Identity *from_23;
  Gazetteer *from_24;
  VisionFeaturePrint *from_25;
  SoundAnalysisPreprocessing *from_26;
  TextClassifier *from_27;
  WordTagger *from_28;
  WordEmbedding *from_29;
  Pipeline *from_30;
  PipelineRegressor *from_31;
  PipelineClassifier *from_32;
  SerializedModel *from_33;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/Model.pb.cc"
               ,0x115b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if ((from != (Model *)&_Model_default_instance_) &&
     (from->description_ != (ModelDescription *)0x0)) {
    if (this->description_ == (ModelDescription *)0x0) {
      pMVar3 = (ModelDescription *)operator_new(0x78);
      ModelDescription::ModelDescription(pMVar3);
      this->description_ = pMVar3;
    }
    pMVar3 = from->description_;
    if (pMVar3 == (ModelDescription *)0x0) {
      pMVar3 = (ModelDescription *)&_ModelDescription_default_instance_;
    }
    ModelDescription::MergeFrom(this->description_,pMVar3);
  }
  if (from->specificationversion_ != 0) {
    this->specificationversion_ = from->specificationversion_;
  }
  if (from->isupdatable_ == true) {
    this->isupdatable_ = true;
  }
  uVar1 = from->_oneof_case_[0];
  if ((int)uVar1 < 600) {
    if ((int)uVar1 < 400) {
      if ((int)uVar1 < 300) {
        if (uVar1 == 200) {
          if (this->_oneof_case_[0] != 200) {
            clear_Type(this);
            this->_oneof_case_[0] = 200;
            pPVar30 = (PipelineClassifier *)operator_new(0x20);
            PipelineClassifier::PipelineClassifier(pPVar30);
            (this->Type_).pipelineclassifier_ = pPVar30;
          }
          pPVar30 = (this->Type_).pipelineclassifier_;
          if (from->_oneof_case_[0] == 200) {
            from_32 = (from->Type_).pipelineclassifier_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_32 = (PipelineClassifier *)&_PipelineClassifier_default_instance_;
          }
          PipelineClassifier::MergeFrom(pPVar30,from_32);
        }
        else if (uVar1 == 0xc9) {
          if (this->_oneof_case_[0] != 0xc9) {
            clear_Type(this);
            this->_oneof_case_[0] = 0xc9;
            pPVar27 = (PipelineRegressor *)operator_new(0x20);
            PipelineRegressor::PipelineRegressor(pPVar27);
            (this->Type_).pipelineregressor_ = pPVar27;
          }
          pPVar27 = (this->Type_).pipelineregressor_;
          if (from->_oneof_case_[0] == 0xc9) {
            from_31 = (from->Type_).pipelineregressor_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_31 = (PipelineRegressor *)&_PipelineRegressor_default_instance_;
          }
          PipelineRegressor::MergeFrom(pPVar27,from_31);
        }
        else if (uVar1 == 0xca) {
          if (this->_oneof_case_[0] != 0xca) {
            clear_Type(this);
            this->_oneof_case_[0] = 0xca;
            pPVar9 = (Pipeline *)operator_new(0x48);
            Pipeline::Pipeline(pPVar9);
            (this->Type_).pipeline_ = pPVar9;
          }
          pPVar9 = (this->Type_).pipeline_;
          if (from->_oneof_case_[0] == 0xca) {
            from_30 = (from->Type_).pipeline_;
          }
          else {
            protobuf_Model_2eproto::InitDefaults();
            from_30 = (Pipeline *)&_Pipeline_default_instance_;
          }
          Pipeline::MergeFrom(pPVar9,from_30);
        }
      }
      else {
        switch(uVar1) {
        case 300:
          if (this->_oneof_case_[0] != 300) {
            clear_Type(this);
            this->_oneof_case_[0] = 300;
            pGVar6 = (GLMRegressor *)operator_new(0x48);
            GLMRegressor::GLMRegressor(pGVar6);
            (this->Type_).glmregressor_ = pGVar6;
          }
          pGVar6 = (this->Type_).glmregressor_;
          if (from->_oneof_case_[0] == 300) {
            from_19 = (from->Type_).glmregressor_;
          }
          else {
            from_19 = GLMRegressor::default_instance();
          }
          GLMRegressor::MergeFrom(pGVar6,from_19);
          break;
        case 0x12d:
          if (this->_oneof_case_[0] != 0x12d) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12d;
            pSVar29 = (SupportVectorRegressor *)operator_new(0x38);
            SupportVectorRegressor::SupportVectorRegressor(pSVar29);
            (this->Type_).supportvectorregressor_ = pSVar29;
          }
          pSVar29 = (this->Type_).supportvectorregressor_;
          if (from->_oneof_case_[0] == 0x12d) {
            from_20 = (from->Type_).supportvectorregressor_;
          }
          else {
            from_20 = SupportVectorRegressor::default_instance();
          }
          SupportVectorRegressor::MergeFrom(pSVar29,from_20);
          break;
        case 0x12e:
          if (this->_oneof_case_[0] != 0x12e) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12e;
            pTVar24 = (TreeEnsembleRegressor *)operator_new(0x20);
            TreeEnsembleRegressor::TreeEnsembleRegressor(pTVar24);
            (this->Type_).treeensembleregressor_ = pTVar24;
          }
          pTVar24 = (this->Type_).treeensembleregressor_;
          if (from->_oneof_case_[0] == 0x12e) {
            from_15 = (from->Type_).treeensembleregressor_;
          }
          else {
            from_15 = TreeEnsembleRegressor::default_instance();
          }
          TreeEnsembleRegressor::MergeFrom(pTVar24,from_15);
          break;
        case 0x12f:
          if (this->_oneof_case_[0] != 0x12f) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x12f;
            pNVar26 = (NeuralNetworkRegressor *)operator_new(0x58);
            NeuralNetworkRegressor::NeuralNetworkRegressor(pNVar26);
            (this->Type_).neuralnetworkregressor_ = pNVar26;
          }
          pNVar26 = (this->Type_).neuralnetworkregressor_;
          if (from->_oneof_case_[0] == 0x12f) {
            from_17 = (from->Type_).neuralnetworkregressor_;
          }
          else {
            from_17 = NeuralNetworkRegressor::default_instance();
          }
          NeuralNetworkRegressor::MergeFrom(pNVar26,from_17);
          break;
        case 0x130:
          if (this->_oneof_case_[0] != 0x130) {
            clear_Type(this);
            this->_oneof_case_[0] = 0x130;
            pBVar20 = (BayesianProbitRegressor *)operator_new(0x78);
            BayesianProbitRegressor::BayesianProbitRegressor(pBVar20);
            (this->Type_).bayesianprobitregressor_ = pBVar20;
          }
          pBVar20 = (this->Type_).bayesianprobitregressor_;
          if (from->_oneof_case_[0] == 0x130) {
            from_09 = (from->Type_).bayesianprobitregressor_;
          }
          else {
            from_09 = BayesianProbitRegressor::default_instance();
          }
          BayesianProbitRegressor::MergeFrom(pBVar20,from_09);
        }
      }
    }
    else if ((int)uVar1 < 500) {
      switch(uVar1) {
      case 400:
        if (this->_oneof_case_[0] != 400) {
          clear_Type(this);
          this->_oneof_case_[0] = 400;
          pGVar4 = (GLMClassifier *)operator_new(0x58);
          GLMClassifier::GLMClassifier(pGVar4);
          (this->Type_).glmclassifier_ = pGVar4;
        }
        pGVar4 = (this->Type_).glmclassifier_;
        if (from->_oneof_case_[0] == 400) {
          from_21 = (from->Type_).glmclassifier_;
        }
        else {
          from_21 = GLMClassifier::default_instance();
        }
        GLMClassifier::MergeFrom(pGVar4,from_21);
        break;
      case 0x191:
        if (this->_oneof_case_[0] != 0x191) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x191;
          pSVar31 = (SupportVectorClassifier *)operator_new(0xb0);
          SupportVectorClassifier::SupportVectorClassifier(pSVar31);
          (this->Type_).supportvectorclassifier_ = pSVar31;
        }
        pSVar31 = (this->Type_).supportvectorclassifier_;
        if (from->_oneof_case_[0] == 0x191) {
          from_22 = (from->Type_).supportvectorclassifier_;
        }
        else {
          from_22 = SupportVectorClassifier::default_instance();
        }
        SupportVectorClassifier::MergeFrom(pSVar31,from_22);
        break;
      case 0x192:
        if (this->_oneof_case_[0] != 0x192) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x192;
          pTVar25 = (TreeEnsembleClassifier *)operator_new(0x30);
          TreeEnsembleClassifier::TreeEnsembleClassifier(pTVar25);
          (this->Type_).treeensembleclassifier_ = pTVar25;
        }
        pTVar25 = (this->Type_).treeensembleclassifier_;
        if (from->_oneof_case_[0] == 0x192) {
          from_16 = (from->Type_).treeensembleclassifier_;
        }
        else {
          from_16 = TreeEnsembleClassifier::default_instance();
        }
        TreeEnsembleClassifier::MergeFrom(pTVar25,from_16);
        break;
      case 0x193:
        if (this->_oneof_case_[0] != 0x193) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x193;
          pNVar28 = (NeuralNetworkClassifier *)operator_new(0x68);
          NeuralNetworkClassifier::NeuralNetworkClassifier(pNVar28);
          (this->Type_).neuralnetworkclassifier_ = pNVar28;
        }
        pNVar28 = (this->Type_).neuralnetworkclassifier_;
        if (from->_oneof_case_[0] == 0x193) {
          from_18 = (from->Type_).neuralnetworkclassifier_;
        }
        else {
          from_18 = NeuralNetworkClassifier::default_instance();
        }
        NeuralNetworkClassifier::MergeFrom(pNVar28,from_18);
        break;
      case 0x194:
        if (this->_oneof_case_[0] != 0x194) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x194;
          pKVar21 = (KNearestNeighborsClassifier *)operator_new(0x48);
          KNearestNeighborsClassifier::KNearestNeighborsClassifier(pKVar21);
          (this->Type_).knearestneighborsclassifier_ = pKVar21;
        }
        pKVar21 = (this->Type_).knearestneighborsclassifier_;
        if (from->_oneof_case_[0] == 0x194) {
          from_10 = (from->Type_).knearestneighborsclassifier_;
        }
        else {
          from_10 = KNearestNeighborsClassifier::default_instance();
        }
        KNearestNeighborsClassifier::MergeFrom(pKVar21,from_10);
      }
    }
    else if ((int)uVar1 < 0x22b) {
      if (uVar1 == 500) {
        if (this->_oneof_case_[0] != 500) {
          clear_Type(this);
          this->_oneof_case_[0] = 500;
          pNVar22 = (NeuralNetwork *)operator_new(0x58);
          NeuralNetwork::NeuralNetwork(pNVar22);
          (this->Type_).neuralnetwork_ = pNVar22;
        }
        pNVar22 = (this->Type_).neuralnetwork_;
        if (from->_oneof_case_[0] == 500) {
          from_11 = (from->Type_).neuralnetwork_;
        }
        else {
          from_11 = NeuralNetwork::default_instance();
        }
        NeuralNetwork::MergeFrom(pNVar22,from_11);
      }
      else if (uVar1 == 0x1f5) {
        if (this->_oneof_case_[0] != 0x1f5) {
          clear_Type(this);
          this->_oneof_case_[0] = 0x1f5;
          pIVar8 = (ItemSimilarityRecommender *)operator_new(0x70);
          ItemSimilarityRecommender::ItemSimilarityRecommender(pIVar8);
          (this->Type_).itemsimilarityrecommender_ = pIVar8;
        }
        pIVar8 = (this->Type_).itemsimilarityrecommender_;
        if (from->_oneof_case_[0] == 0x1f5) {
          from_13 = (from->Type_).itemsimilarityrecommender_;
        }
        else {
          from_13 = ItemSimilarityRecommender::default_instance();
        }
        ItemSimilarityRecommender::MergeFrom(pIVar8,from_13);
      }
    }
    else if (uVar1 == 0x22b) {
      if (this->_oneof_case_[0] != 0x22b) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x22b;
        pCVar23 = (CustomModel *)operator_new(0x48);
        CustomModel::CustomModel(pCVar23);
        (this->Type_).custommodel_ = pCVar23;
      }
      pCVar23 = (this->Type_).custommodel_;
      if (from->_oneof_case_[0] == 0x22b) {
        from_12 = (from->Type_).custommodel_;
      }
      else {
        from_12 = CustomModel::default_instance();
      }
      CustomModel::MergeFrom(pCVar23,from_12);
    }
    else if (uVar1 == 0x22c) {
      if (this->_oneof_case_[0] != 0x22c) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x22c;
        pLVar11 = (LinkedModel *)operator_new(0x20);
        LinkedModel::LinkedModel(pLVar11);
        (this->Type_).linkedmodel_ = pLVar11;
      }
      pLVar11 = (this->Type_).linkedmodel_;
      if (from->_oneof_case_[0] == 0x22c) {
        from_14 = (from->Type_).linkedmodel_;
      }
      else {
        from_14 = LinkedModel::default_instance();
      }
      LinkedModel::MergeFrom(pLVar11,from_14);
    }
  }
  else if ((int)uVar1 < 900) {
    switch(uVar1) {
    case 600:
      if (this->_oneof_case_[0] != 600) {
        clear_Type(this);
        this->_oneof_case_[0] = 600;
        pOVar5 = (OneHotEncoder *)operator_new(0x28);
        OneHotEncoder::OneHotEncoder(pOVar5);
        (this->Type_).onehotencoder_ = pOVar5;
      }
      pOVar5 = (this->Type_).onehotencoder_;
      if (from->_oneof_case_[0] == 600) {
        from_06 = (from->Type_).onehotencoder_;
      }
      else {
        from_06 = OneHotEncoder::default_instance();
      }
      OneHotEncoder::MergeFrom(pOVar5,from_06);
      break;
    case 0x259:
      if (this->_oneof_case_[0] != 0x259) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x259;
        pIVar16 = (Imputer *)operator_new(0x30);
        Imputer::Imputer(pIVar16);
        (this->Type_).imputer_ = pIVar16;
      }
      pIVar16 = (this->Type_).imputer_;
      if (from->_oneof_case_[0] == 0x259) {
        from_04 = (from->Type_).imputer_;
      }
      else {
        from_04 = Imputer::default_instance();
      }
      Imputer::MergeFrom(pIVar16,from_04);
      break;
    case 0x25a:
      if (this->_oneof_case_[0] != 0x25a) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25a;
        pFVar17 = (FeatureVectorizer *)operator_new(0x30);
        FeatureVectorizer::FeatureVectorizer(pFVar17);
        (this->Type_).featurevectorizer_ = pFVar17;
      }
      pFVar17 = (this->Type_).featurevectorizer_;
      if (from->_oneof_case_[0] == 0x25a) {
        from_05 = (from->Type_).featurevectorizer_;
      }
      else {
        from_05 = FeatureVectorizer::default_instance();
      }
      FeatureVectorizer::MergeFrom(pFVar17,from_05);
      break;
    case 0x25b:
      if (this->_oneof_case_[0] != 0x25b) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25b;
        pDVar18 = (DictVectorizer *)operator_new(0x20);
        DictVectorizer::DictVectorizer(pDVar18);
        (this->Type_).dictvectorizer_ = pDVar18;
      }
      pDVar18 = (this->Type_).dictvectorizer_;
      if (from->_oneof_case_[0] == 0x25b) {
        from_07 = (from->Type_).dictvectorizer_;
      }
      else {
        from_07 = DictVectorizer::default_instance();
      }
      DictVectorizer::MergeFrom(pDVar18,from_07);
      break;
    case 0x25c:
      if (this->_oneof_case_[0] != 0x25c) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25c;
        pSVar15 = (Scaler *)operator_new(0x40);
        Scaler::Scaler(pSVar15);
        (this->Type_).scaler_ = pSVar15;
      }
      pSVar15 = (this->Type_).scaler_;
      if (from->_oneof_case_[0] == 0x25c) {
        from_03 = (from->Type_).scaler_;
      }
      else {
        from_03 = Scaler::default_instance();
      }
      Scaler::MergeFrom(pSVar15,from_03);
      break;
    case 0x25e:
      if (this->_oneof_case_[0] != 0x25e) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25e;
        pCVar14 = (CategoricalMapping *)operator_new(0x30);
        CategoricalMapping::CategoricalMapping(pCVar14);
        (this->Type_).categoricalmapping_ = pCVar14;
      }
      pCVar14 = (this->Type_).categoricalmapping_;
      if (from->_oneof_case_[0] == 0x25e) {
        from_02 = (from->Type_).categoricalmapping_;
      }
      else {
        from_02 = CategoricalMapping::default_instance();
      }
      CategoricalMapping::MergeFrom(pCVar14,from_02);
      break;
    case 0x25f:
      if (this->_oneof_case_[0] != 0x25f) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x25f;
        pNVar19 = (Normalizer *)operator_new(0x18);
        Normalizer::Normalizer(pNVar19);
        (this->Type_).normalizer_ = pNVar19;
      }
      pNVar19 = (this->Type_).normalizer_;
      if (from->_oneof_case_[0] == 0x25f) {
        from_08 = (from->Type_).normalizer_;
      }
      else {
        from_08 = Normalizer::default_instance();
      }
      Normalizer::MergeFrom(pNVar19,from_08);
      break;
    case 0x261:
      if (this->_oneof_case_[0] != 0x261) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x261;
        pAVar13 = (ArrayFeatureExtractor *)operator_new(0x28);
        ArrayFeatureExtractor::ArrayFeatureExtractor(pAVar13);
        (this->Type_).arrayfeatureextractor_ = pAVar13;
      }
      pAVar13 = (this->Type_).arrayfeatureextractor_;
      if (from->_oneof_case_[0] == 0x261) {
        from_01 = (from->Type_).arrayfeatureextractor_;
      }
      else {
        from_01 = ArrayFeatureExtractor::default_instance();
      }
      ArrayFeatureExtractor::MergeFrom(pAVar13,from_01);
      break;
    case 0x262:
      if (this->_oneof_case_[0] != 0x262) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x262;
        pNVar12 = (NonMaximumSuppression *)operator_new(0x70);
        NonMaximumSuppression::NonMaximumSuppression(pNVar12);
        (this->Type_).nonmaximumsuppression_ = pNVar12;
      }
      pNVar12 = (this->Type_).nonmaximumsuppression_;
      if (from->_oneof_case_[0] == 0x262) {
        from_00 = (from->Type_).nonmaximumsuppression_;
      }
      else {
        from_00 = NonMaximumSuppression::default_instance();
      }
      NonMaximumSuppression::MergeFrom(pNVar12,from_00);
    }
  }
  else {
    switch(uVar1) {
    case 2000:
      if (this->_oneof_case_[0] != 2000) {
        clear_Type(this);
        this->_oneof_case_[0] = 2000;
        pTVar7 = (TextClassifier *)operator_new(0x38);
        CoreMLModels::TextClassifier::TextClassifier(pTVar7);
        (this->Type_).textclassifier_ = pTVar7;
      }
      pTVar7 = (this->Type_).textclassifier_;
      if (from->_oneof_case_[0] == 2000) {
        from_27 = (from->Type_).textclassifier_;
      }
      else {
        from_27 = CoreMLModels::TextClassifier::default_instance();
      }
      CoreMLModels::TextClassifier::MergeFrom(pTVar7,from_27);
      break;
    case 0x7d1:
      if (this->_oneof_case_[0] != 0x7d1) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d1;
        pWVar36 = (WordTagger *)operator_new(0x58);
        CoreMLModels::WordTagger::WordTagger(pWVar36);
        (this->Type_).wordtagger_ = pWVar36;
      }
      pWVar36 = (this->Type_).wordtagger_;
      if (from->_oneof_case_[0] == 0x7d1) {
        from_28 = (from->Type_).wordtagger_;
      }
      else {
        from_28 = CoreMLModels::WordTagger::default_instance();
      }
      CoreMLModels::WordTagger::MergeFrom(pWVar36,from_28);
      break;
    case 0x7d2:
      if (this->_oneof_case_[0] != 0x7d2) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d2;
        pVVar34 = (VisionFeaturePrint *)operator_new(0x20);
        CoreMLModels::VisionFeaturePrint::VisionFeaturePrint(pVVar34);
        (this->Type_).visionfeatureprint_ = pVVar34;
      }
      pVVar34 = (this->Type_).visionfeatureprint_;
      if (from->_oneof_case_[0] == 0x7d2) {
        from_25 = (from->Type_).visionfeatureprint_;
      }
      else {
        from_25 = CoreMLModels::VisionFeaturePrint::default_instance();
      }
      CoreMLModels::VisionFeaturePrint::MergeFrom(pVVar34,from_25);
      break;
    case 0x7d3:
      if (this->_oneof_case_[0] != 0x7d3) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d3;
        pSVar35 = (SoundAnalysisPreprocessing *)operator_new(0x20);
        CoreMLModels::SoundAnalysisPreprocessing::SoundAnalysisPreprocessing(pSVar35);
        (this->Type_).soundanalysispreprocessing_ = pSVar35;
      }
      pSVar35 = (this->Type_).soundanalysispreprocessing_;
      if (from->_oneof_case_[0] == 0x7d3) {
        from_26 = (from->Type_).soundanalysispreprocessing_;
      }
      else {
        from_26 = CoreMLModels::SoundAnalysisPreprocessing::default_instance();
      }
      CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(pSVar35,from_26);
      break;
    case 0x7d4:
      if (this->_oneof_case_[0] != 0x7d4) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d4;
        pGVar33 = (Gazetteer *)operator_new(0x38);
        CoreMLModels::Gazetteer::Gazetteer(pGVar33);
        (this->Type_).gazetteer_ = pGVar33;
      }
      pGVar33 = (this->Type_).gazetteer_;
      if (from->_oneof_case_[0] == 0x7d4) {
        from_24 = (from->Type_).gazetteer_;
      }
      else {
        from_24 = CoreMLModels::Gazetteer::default_instance();
      }
      CoreMLModels::Gazetteer::MergeFrom(pGVar33,from_24);
      break;
    case 0x7d5:
      if (this->_oneof_case_[0] != 0x7d5) {
        clear_Type(this);
        this->_oneof_case_[0] = 0x7d5;
        pWVar37 = (WordEmbedding *)operator_new(0x28);
        CoreMLModels::WordEmbedding::WordEmbedding(pWVar37);
        (this->Type_).wordembedding_ = pWVar37;
      }
      pWVar37 = (this->Type_).wordembedding_;
      if (from->_oneof_case_[0] == 0x7d5) {
        from_29 = (from->Type_).wordembedding_;
      }
      else {
        from_29 = CoreMLModels::WordEmbedding::default_instance();
      }
      CoreMLModels::WordEmbedding::MergeFrom(pWVar37,from_29);
      break;
    default:
      if (uVar1 == 900) {
        if (this->_oneof_case_[0] != 900) {
          clear_Type(this);
          this->_oneof_case_[0] = 900;
          pIVar32 = (Identity *)operator_new(0x18);
          Identity::Identity(pIVar32);
          (this->Type_).identity_ = pIVar32;
        }
        pIVar32 = (this->Type_).identity_;
        if (from->_oneof_case_[0] == 900) {
          from_23 = (from->Type_).identity_;
        }
        else {
          from_23 = Identity::default_instance();
        }
        Identity::MergeFrom(pIVar32,from_23);
      }
      else if (uVar1 == 3000) {
        if (this->_oneof_case_[0] != 3000) {
          clear_Type(this);
          this->_oneof_case_[0] = 3000;
          pSVar10 = (SerializedModel *)operator_new(0x28);
          SerializedModel::SerializedModel(pSVar10);
          (this->Type_).serializedmodel_ = pSVar10;
        }
        pSVar10 = (this->Type_).serializedmodel_;
        if (from->_oneof_case_[0] == 3000) {
          from_33 = (from->Type_).serializedmodel_;
        }
        else {
          protobuf_Model_2eproto::InitDefaults();
          from_33 = (SerializedModel *)&_SerializedModel_default_instance_;
        }
        SerializedModel::MergeFrom(pSVar10,from_33);
      }
    }
  }
  return;
}

Assistant:

void Model::MergeFrom(const Model& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Model)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_description()) {
    mutable_description()->::CoreML::Specification::ModelDescription::MergeFrom(from.description());
  }
  if (from.specificationversion() != 0) {
    set_specificationversion(from.specificationversion());
  }
  if (from.isupdatable() != 0) {
    set_isupdatable(from.isupdatable());
  }
  switch (from.Type_case()) {
    case kPipelineClassifier: {
      mutable_pipelineclassifier()->::CoreML::Specification::PipelineClassifier::MergeFrom(from.pipelineclassifier());
      break;
    }
    case kPipelineRegressor: {
      mutable_pipelineregressor()->::CoreML::Specification::PipelineRegressor::MergeFrom(from.pipelineregressor());
      break;
    }
    case kPipeline: {
      mutable_pipeline()->::CoreML::Specification::Pipeline::MergeFrom(from.pipeline());
      break;
    }
    case kGlmRegressor: {
      mutable_glmregressor()->::CoreML::Specification::GLMRegressor::MergeFrom(from.glmregressor());
      break;
    }
    case kSupportVectorRegressor: {
      mutable_supportvectorregressor()->::CoreML::Specification::SupportVectorRegressor::MergeFrom(from.supportvectorregressor());
      break;
    }
    case kTreeEnsembleRegressor: {
      mutable_treeensembleregressor()->::CoreML::Specification::TreeEnsembleRegressor::MergeFrom(from.treeensembleregressor());
      break;
    }
    case kNeuralNetworkRegressor: {
      mutable_neuralnetworkregressor()->::CoreML::Specification::NeuralNetworkRegressor::MergeFrom(from.neuralnetworkregressor());
      break;
    }
    case kBayesianProbitRegressor: {
      mutable_bayesianprobitregressor()->::CoreML::Specification::BayesianProbitRegressor::MergeFrom(from.bayesianprobitregressor());
      break;
    }
    case kGlmClassifier: {
      mutable_glmclassifier()->::CoreML::Specification::GLMClassifier::MergeFrom(from.glmclassifier());
      break;
    }
    case kSupportVectorClassifier: {
      mutable_supportvectorclassifier()->::CoreML::Specification::SupportVectorClassifier::MergeFrom(from.supportvectorclassifier());
      break;
    }
    case kTreeEnsembleClassifier: {
      mutable_treeensembleclassifier()->::CoreML::Specification::TreeEnsembleClassifier::MergeFrom(from.treeensembleclassifier());
      break;
    }
    case kNeuralNetworkClassifier: {
      mutable_neuralnetworkclassifier()->::CoreML::Specification::NeuralNetworkClassifier::MergeFrom(from.neuralnetworkclassifier());
      break;
    }
    case kKNearestNeighborsClassifier: {
      mutable_knearestneighborsclassifier()->::CoreML::Specification::KNearestNeighborsClassifier::MergeFrom(from.knearestneighborsclassifier());
      break;
    }
    case kNeuralNetwork: {
      mutable_neuralnetwork()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.neuralnetwork());
      break;
    }
    case kItemSimilarityRecommender: {
      mutable_itemsimilarityrecommender()->::CoreML::Specification::ItemSimilarityRecommender::MergeFrom(from.itemsimilarityrecommender());
      break;
    }
    case kCustomModel: {
      mutable_custommodel()->::CoreML::Specification::CustomModel::MergeFrom(from.custommodel());
      break;
    }
    case kLinkedModel: {
      mutable_linkedmodel()->::CoreML::Specification::LinkedModel::MergeFrom(from.linkedmodel());
      break;
    }
    case kOneHotEncoder: {
      mutable_onehotencoder()->::CoreML::Specification::OneHotEncoder::MergeFrom(from.onehotencoder());
      break;
    }
    case kImputer: {
      mutable_imputer()->::CoreML::Specification::Imputer::MergeFrom(from.imputer());
      break;
    }
    case kFeatureVectorizer: {
      mutable_featurevectorizer()->::CoreML::Specification::FeatureVectorizer::MergeFrom(from.featurevectorizer());
      break;
    }
    case kDictVectorizer: {
      mutable_dictvectorizer()->::CoreML::Specification::DictVectorizer::MergeFrom(from.dictvectorizer());
      break;
    }
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::Scaler::MergeFrom(from.scaler());
      break;
    }
    case kCategoricalMapping: {
      mutable_categoricalmapping()->::CoreML::Specification::CategoricalMapping::MergeFrom(from.categoricalmapping());
      break;
    }
    case kNormalizer: {
      mutable_normalizer()->::CoreML::Specification::Normalizer::MergeFrom(from.normalizer());
      break;
    }
    case kArrayFeatureExtractor: {
      mutable_arrayfeatureextractor()->::CoreML::Specification::ArrayFeatureExtractor::MergeFrom(from.arrayfeatureextractor());
      break;
    }
    case kNonMaximumSuppression: {
      mutable_nonmaximumsuppression()->::CoreML::Specification::NonMaximumSuppression::MergeFrom(from.nonmaximumsuppression());
      break;
    }
    case kIdentity: {
      mutable_identity()->::CoreML::Specification::Identity::MergeFrom(from.identity());
      break;
    }
    case kTextClassifier: {
      mutable_textclassifier()->::CoreML::Specification::CoreMLModels::TextClassifier::MergeFrom(from.textclassifier());
      break;
    }
    case kWordTagger: {
      mutable_wordtagger()->::CoreML::Specification::CoreMLModels::WordTagger::MergeFrom(from.wordtagger());
      break;
    }
    case kVisionFeaturePrint: {
      mutable_visionfeatureprint()->::CoreML::Specification::CoreMLModels::VisionFeaturePrint::MergeFrom(from.visionfeatureprint());
      break;
    }
    case kSoundAnalysisPreprocessing: {
      mutable_soundanalysispreprocessing()->::CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergeFrom(from.soundanalysispreprocessing());
      break;
    }
    case kGazetteer: {
      mutable_gazetteer()->::CoreML::Specification::CoreMLModels::Gazetteer::MergeFrom(from.gazetteer());
      break;
    }
    case kWordEmbedding: {
      mutable_wordembedding()->::CoreML::Specification::CoreMLModels::WordEmbedding::MergeFrom(from.wordembedding());
      break;
    }
    case kSerializedModel: {
      mutable_serializedmodel()->::CoreML::Specification::SerializedModel::MergeFrom(from.serializedmodel());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}